

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::ByteSizeLong
          (FeatureVectorizer_InputColumn *this)

{
  string *value;
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  
  value = (this->inputcolumn_).ptr_;
  if (value->_M_string_length == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar2 = sVar2 + 1;
  }
  if (this->inputdimensions_ != 0) {
    uVar3 = this->inputdimensions_ | 1;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t FeatureVectorizer_InputColumn::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FeatureVectorizer.InputColumn)
  size_t total_size = 0;

  // string inputColumn = 1;
  if (this->inputcolumn().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->inputcolumn());
  }

  // uint64 inputDimensions = 2;
  if (this->inputdimensions() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputdimensions());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}